

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O1

bool Diligent::VerifyBindSparseResourceMemoryAttribs
               (IRenderDevice *pDevice,BindSparseResourceMemoryAttribs *Attribs)

{
  Uint64 *Args_8;
  SparseBufferMemoryBindRange *Args_5;
  SparseBufferMemoryBindRange *pSVar1;
  SparseTextureMemoryBindRange *Args_5_00;
  uint uVar2;
  SparseBufferMemoryBindInfo *pSVar3;
  IDeviceMemory *pIVar4;
  SparseTextureMemoryBindRange *pSVar5;
  char (*Args_7) [41];
  Uint32 *pUVar6;
  int iVar7;
  int iVar8;
  Uint32 UVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TextureDesc *TexDesc;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  uint uVar11;
  Uint32 *in_RCX;
  uint extraout_EDX;
  Uint32 UVar12;
  SparseTextureMemoryBindInfo *pSVar13;
  char *in_R8;
  char (*in_R9) [45];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  Uint64 *pUVar15;
  Uint32 *pUVar16;
  char (*Args_9) [32];
  Box *Args_5_01;
  char (*Args_9_00) [86];
  char (*Args_5_02) [42];
  char (*pacVar17) [2];
  char (*Args_9_01) [84];
  char (*Args_5_03) [43];
  char (*in_stack_fffffffffffffee8) [10];
  uint local_110;
  uint local_10c;
  string msg_21;
  string msg;
  Uint64 Capacity;
  Uint32 MipDepth;
  Uint32 MipHeight;
  Uint32 MipWidth;
  BindSparseResourceMemoryAttribs *local_a0;
  char (*local_98) [45];
  Uint32 *local_90;
  int local_84;
  Uint32 *local_80;
  char (*local_78) [39];
  char (*local_70) [41];
  char (*local_68) [42];
  char (*local_60) [42];
  Uint32 *local_58;
  Uint32 *local_50;
  SparseTextureMemoryBindInfo *local_48;
  char (*local_40) [41];
  Uint32 *local_38;
  undefined4 extraout_var_05;
  
  iVar7 = (*(pDevice->super_IObject)._vptr_IObject[0x19])();
  pUVar16 = &Attribs->NumBufferBinds;
  if (Attribs->NumBufferBinds != 0) {
    if (Attribs->pBufferBinds == (SparseBufferMemoryBindInfo *)0x0) {
      in_R8 = ", but pBufferBinds is null";
      FormatString<char[41],char[19],unsigned_int,char[27]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"NumBufferBinds is ",(char (*) [19])pUVar16,
                 (uint *)", but pBufferBinds is null",(char (*) [27])in_R9);
      in_RCX = (Uint32 *)0x471;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x471);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,
                        CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                 msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    if ((*(byte *)(CONCAT44(extraout_var,iVar7) + 0x1b0) & 2) == 0) {
      FormatString<char[41],char[91]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])
                 "NumBufferBinds must be zero if SPARSE_RESOURCE_CAP_FLAG_BUFFER capability is not supported"
                 ,(char (*) [91])in_RCX);
      in_RCX = (Uint32 *)0x472;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x472);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,
                        CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                 msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
  }
  local_80 = &Attribs->NumTextureBinds;
  if (Attribs->NumTextureBinds != 0) {
    if (Attribs->pTextureBinds == (SparseTextureMemoryBindInfo *)0x0) {
      in_R8 = ", but pTextureBinds is null";
      FormatString<char[41],char[20],unsigned_int,char[28]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"NumTextureBinds is ",(char (*) [20])local_80,
                 (uint *)", but pTextureBinds is null",(char (*) [28])in_R9);
      in_RCX = (Uint32 *)0x476;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x476);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,
                        CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                 msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    if ((*(byte *)(CONCAT44(extraout_var,iVar7) + 0x1b0) & 4) == 0) {
      FormatString<char[41],char[96]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])
                 "NumTextureBinds must be zero if SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D capability is not supported"
                 ,(char (*) [96])in_RCX);
      in_RCX = (Uint32 *)0x477;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x477);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,
                        CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                 msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
  }
  if (*local_80 == 0 && *pUVar16 == 0) {
    FormatString<char[41],char[59]>
              (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
               (char (*) [41])"One of NumBufferBinds and NumTextureBinds must not be zero",
               (char (*) [59])in_RCX);
    in_RCX = (Uint32 *)0x47a;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x47a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,
                      CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                               msg.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  iVar7 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
  local_84 = *(int *)CONCAT44(extraout_var_00,iVar7);
  local_110 = 0;
  local_a0 = Attribs;
  pUVar6 = pUVar16;
  if (*pUVar16 != 0) {
    do {
      local_90 = pUVar6;
      pSVar3 = Attribs->pBufferBinds;
      uVar10 = (ulong)local_110;
      if (pSVar3[uVar10].pBuffer == (IBuffer *)0x0) {
        in_R8 = "].pBuffer must not be null";
        FormatString<char[41],char[14],unsigned_int,char[27]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"pBufferBinds[",(char (*) [14])&local_110,
                   (uint *)"].pBuffer must not be null",(char (*) [27])in_R9);
        in_RCX = (Uint32 *)0x482;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x482);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,
                          CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                   msg.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      pSVar3 = pSVar3 + uVar10;
      if (pSVar3->NumRanges == 0) {
        in_R8 = "].NumRanges must not be zero";
        FormatString<char[41],char[14],unsigned_int,char[29]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"pBufferBinds[",(char (*) [14])&local_110,
                   (uint *)"].NumRanges must not be zero",(char (*) [29])in_R9);
        in_RCX = (Uint32 *)0x483;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x483);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,
                          CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                   msg.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      if (pSVar3->pRanges == (SparseBufferMemoryBindRange *)0x0) {
        in_R8 = "].pRanges must not be null";
        FormatString<char[41],char[14],unsigned_int,char[27]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"pBufferBinds[",(char (*) [14])&local_110,
                   (uint *)"].pRanges must not be null",(char (*) [27])in_R9);
        in_RCX = (Uint32 *)0x484;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x484);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,
                          CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                   msg.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      if (pSVar3->pBuffer != (IBuffer *)0x0) {
        iVar7 = (*(pSVar3->pBuffer->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        if (*(char *)(CONCAT44(extraout_var_01,iVar7) + 0x14) != '\x05') {
          in_R8 = "].pBuffer must be created with USAGE_SPARSE";
          FormatString<char[41],char[14],unsigned_int,char[44]>
                    (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                     (char (*) [41])"pBufferBinds[",(char (*) [14])&local_110,
                     (uint *)"].pBuffer must be created with USAGE_SPARSE",(char (*) [44])in_R9);
          in_RCX = (Uint32 *)0x48a;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x48a);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,
                            CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                     msg.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
        if (pSVar3->pRanges != (SparseBufferMemoryBindRange *)0x0) {
          Args_9_00 = (char (*) [86])0x47eed6;
          iVar8 = (*(pSVar3->pBuffer->super_IDeviceObject).super_IObject._vptr_IObject[0x10])();
          msg_21._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_02,iVar8);
          local_10c = 0;
          Attribs = local_a0;
          pUVar16 = local_90;
          if (pSVar3->NumRanges != 0) {
            Args_9 = (char (*) [32])(CONCAT44(extraout_var_01,iVar7) + 8);
            msg_21._M_string_length._0_4_ = extraout_EDX;
            do {
              paVar14 = &msg.field_2;
              Args_5 = pSVar3->pRanges + local_10c;
              pSVar1 = pSVar3->pRanges + local_10c;
              pUVar15 = &pSVar1->MemorySize;
              if (*(ulong *)*Args_9 < *pUVar15 + pSVar1->BufferOffset) {
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&local_10c;
                FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[33],unsigned_long,char[11],unsigned_long,char[32],unsigned_long,char[2]>
                          (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pBufferBinds[",(char (*) [14])&local_110,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,
                           (uint *)"] specifies a range with offset ",(char (*) [33])Args_5,
                           (unsigned_long *)" and size ",(char (*) [11])pUVar15,
                           (unsigned_long *)" that exceeds the buffer size (",Args_9,
                           (unsigned_long *)0x752f31,(char (*) [2])Args_9_00);
                Args_9_00 = (char (*) [86])0x47ef93;
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x495);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != paVar14) {
                  Args_9_00 = (char (*) [86])0x47efaa;
                  operator_delete(msg._M_dataplus._M_p,
                                  CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                           msg.field_2._M_allocated_capacity._0_4_) + 1);
                }
              }
              if (Args_5->BufferOffset % (ulong)(uint)msg_21._M_string_length != 0) {
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&local_10c;
                FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[17],unsigned_long,char[48],unsigned_int,char[2]>
                          (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pBufferBinds[",(char (*) [14])&local_110,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].BufferOffset (",
                           (char (*) [17])Args_5,
                           (unsigned_long *)") must be a multiple of the buffer block size (",
                           (char (*) [48])&msg_21._M_string_length,(uint *)0x752f31,
                           (char (*) [2])Args_9_00);
                Args_9_00 = (char (*) [86])0x47f029;
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x498);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != paVar14) {
                  Args_9_00 = (char (*) [86])0x47f040;
                  operator_delete(msg._M_dataplus._M_p,
                                  CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                           msg.field_2._M_allocated_capacity._0_4_) + 1);
                }
              }
              if (*pUVar15 == 0) {
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&local_10c;
                FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[30]>
                          (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pBufferBinds[",(char (*) [14])&local_110,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,
                           (uint *)"].MemorySize must not be zero",(char (*) [30])Args_9_00);
                Args_9_00 = (char (*) [86])0x47f099;
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x49b);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != paVar14) {
                  Args_9_00 = (char (*) [86])0x47f0b0;
                  operator_delete(msg._M_dataplus._M_p,
                                  CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                           msg.field_2._M_allocated_capacity._0_4_) + 1);
                }
              }
              in_RCX = (Uint32 *)(ulong)(uint)msg_21._M_string_length;
              if (*pUVar15 % (ulong)in_RCX != 0) {
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&local_10c;
                FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[59],unsigned_int,char[2]>
                          (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pBufferBinds[",(char (*) [14])&local_110,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,
                           (uint *)"].MemorySize must be a multiple of the buffer block size (",
                           (char (*) [59])&msg_21._M_string_length,(uint *)0x752f31,
                           (char (*) [2])Args_9_00);
                in_RCX = (Uint32 *)0x49d;
                Args_9_00 = (char (*) [86])0x47f122;
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x49d);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != paVar14) {
                  Args_9_00 = (char (*) [86])0x47f139;
                  operator_delete(msg._M_dataplus._M_p,
                                  CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                           msg.field_2._M_allocated_capacity._0_4_) + 1);
                }
              }
              pIVar4 = Args_5->pMemory;
              if (pIVar4 == (IDeviceMemory *)0x0) {
                if (Args_5->MemoryOffset != 0) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[52]>
                            (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pBufferBinds[",(char (*) [14])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"]: if pMemory is null, but MemoryOffset is not zero",
                             (char (*) [52])Args_9_00);
                  in_RCX = (Uint32 *)0x4b4;
                  Args_9_00 = (char (*) [86])0x47f38a;
                  DebugAssertionFailed
                            (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4b4);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg._M_dataplus._M_p != paVar14) {
                    Args_9_00 = (char (*) [86])0x47f3a1;
                    operator_delete(msg._M_dataplus._M_p,
                                    CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                             msg.field_2._M_allocated_capacity._0_4_) + 1);
                  }
                }
              }
              else {
                Args_5_02 = (char (*) [42])0x47f14f;
                iVar7 = (*(pIVar4->super_IDeviceObject).super_IObject._vptr_IObject[10])
                                  (pIVar4,pSVar3->pBuffer);
                if ((char)iVar7 == '\0') {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[42]>
                            (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pBufferBinds[",(char (*) [14])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"].pMemory must be compatible with pBuffer",Args_5_02);
                  DebugAssertionFailed
                            (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4a2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg._M_dataplus._M_p != paVar14) {
                    operator_delete(msg._M_dataplus._M_p,
                                    CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                             msg.field_2._M_allocated_capacity._0_4_) + 1);
                  }
                }
                pacVar17 = (char (*) [2])0x47f1c6;
                iVar7 = (*(Args_5->pMemory->super_IDeviceObject).super_IObject._vptr_IObject[9])();
                Capacity = CONCAT44(extraout_var_03,iVar7);
                if (Capacity < Args_5->MemorySize + Args_5->MemoryOffset) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[33],unsigned_long,char[11],unsigned_long,char[39],unsigned_long,char[2]>
                            (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pBufferBinds[",(char (*) [14])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"] specifies a range with offset ",
                             (char (*) [33])&Args_5->MemoryOffset,(unsigned_long *)" and size ",
                             (char (*) [11])pUVar15,
                             (unsigned_long *)" that exceeds the device memory size (",
                             (char (*) [39])&Capacity,(unsigned_long *)0x752f31,pacVar17);
                  DebugAssertionFailed
                            (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4a7);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg._M_dataplus._M_p != &msg.field_2) {
                    operator_delete(msg._M_dataplus._M_p,
                                    CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                             msg.field_2._M_allocated_capacity._0_4_) + 1);
                  }
                }
                Args_9_00 = (char (*) [86])0x47f27a;
                iVar7 = (*(Args_5->pMemory->super_IDeviceObject).super_IObject._vptr_IObject[4])();
                in_RCX = *(Uint32 **)(CONCAT44(extraout_var_04,iVar7) + 0x10);
                if (in_RCX < (char (*) [96])
                             (Args_5->MemoryOffset % (ulong)in_RCX + Args_5->MemorySize)) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[33],unsigned_long,char[11],unsigned_long,char[86]>
                            (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pBufferBinds[",(char (*) [14])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"] specifies a range with offset ",
                             (char (*) [33])&Args_5->MemoryOffset,(unsigned_long *)" and size ",
                             (char (*) [11])pUVar15,
                             (unsigned_long *)
                             " that does not fit into a single page. in Direct3D12 and Vulkan this will be an error"
                             ,Args_9_00);
                  in_RCX = (Uint32 *)0x4af;
                  Args_9_00 = (char (*) [86])0x47f2fa;
                  DebugAssertionFailed
                            (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4af);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg._M_dataplus._M_p != &msg.field_2) {
                    Args_9_00 = (char (*) [86])0x47f316;
                    operator_delete(msg._M_dataplus._M_p,
                                    CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                             msg.field_2._M_allocated_capacity._0_4_) + 1);
                  }
                }
              }
              local_10c = local_10c + 1;
              Attribs = local_a0;
              pUVar16 = local_90;
            } while (local_10c < pSVar3->NumRanges);
          }
        }
      }
      local_110 = local_110 + 1;
      pUVar6 = local_90;
    } while (local_110 < *pUVar16);
  }
  local_110 = 0;
  if (*local_80 != 0) {
    uVar10 = 0;
    do {
      paVar14 = &msg.field_2;
      pSVar13 = Attribs->pTextureBinds;
      if (pSVar13[uVar10].pTexture == (ITexture *)0x0) {
        in_R8 = "].pTexture must not be null";
        FormatString<char[41],char[15],unsigned_int,char[28]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                   (uint *)"].pTexture must not be null",(char (*) [28])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x4bc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != paVar14) {
          operator_delete(msg._M_dataplus._M_p,
                          CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                   msg.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      pSVar13 = pSVar13 + uVar10;
      if (pSVar13->NumRanges == 0) {
        in_R8 = "].NumRanges must not be zero";
        FormatString<char[41],char[15],unsigned_int,char[29]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                   (uint *)"].NumRanges must not be zero",(char (*) [29])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x4bd);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != paVar14) {
          operator_delete(msg._M_dataplus._M_p,
                          CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                   msg.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      if (pSVar13->pRanges == (SparseTextureMemoryBindRange *)0x0) {
        in_R8 = "].pRanges must not be null";
        FormatString<char[41],char[15],unsigned_int,char[27]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                   (uint *)"].pRanges must not be null",(char (*) [27])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x4be);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != paVar14) {
          operator_delete(msg._M_dataplus._M_p,
                          CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                   msg.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      if (pSVar13->pTexture != (ITexture *)0x0) {
        iVar7 = (*(pSVar13->pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        TexDesc = (TextureDesc *)CONCAT44(extraout_var_05,iVar7);
        if (TexDesc->Usage != USAGE_SPARSE) {
          in_R8 = "].pTexture must be created with USAGE_SPARSE";
          FormatString<char[41],char[15],unsigned_int,char[45]>
                    (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                     (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                     (uint *)"].pTexture must be created with USAGE_SPARSE",in_R9);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x4c4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != paVar14) {
            operator_delete(msg._M_dataplus._M_p,
                            CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                     msg.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
        if (pSVar13->pRanges != (SparseTextureMemoryBindRange *)0x0) {
          iVar7 = (*(pSVar13->pTexture->super_IDeviceObject).super_IObject._vptr_IObject[0xd])();
          local_98 = (char (*) [45])CONCAT44(extraout_var_06,iVar7);
          local_10c = 0;
          Attribs = local_a0;
          if (pSVar13->NumRanges != 0) {
            local_38 = &TexDesc->MipLevels;
            local_60 = (char (*) [42])(*local_98 + 0x20);
            local_78 = (char (*) [39])(*local_98 + 0x18);
            local_90 = (Uint32 *)((long)(local_98 + 1) + 3);
            local_40 = (char (*) [41])(*local_98 + 0x24);
            local_68 = (char (*) [42])(*local_98 + 0x28);
            local_70 = (char (*) [41])(*local_98 + 0x2c);
            iVar7 = local_84;
            local_48 = pSVar13;
            do {
              paVar14 = &msg_21.field_2;
              pSVar5 = pSVar13->pRanges;
              uVar10 = (ulong)local_10c;
              Args_5_00 = pSVar5 + uVar10;
              Args_9_01 = (char (*) [84])0x47f649;
              GetMipLevelProperties((MipLevelProperties *)&msg,TexDesc,pSVar5[uVar10].MipLevel);
              MipWidth = (Uint32)msg._M_string_length;
              MipHeight = msg._M_string_length._4_4_;
              MipDepth = msg.field_2._M_allocated_capacity._0_4_;
              if (TexDesc->MipLevels <= pSVar5[uVar10].MipLevel) {
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&local_10c;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[13],unsigned_int,char[42],unsigned_int,char[3]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].MipLevel (",
                           (char (*) [13])Args_5_00,
                           (uint *)") must be less than the mip level count (",
                           (char (*) [42])local_38,(uint *)0x773e90,(char (*) [3])Args_9_01);
                Args_9_01 = (char (*) [84])0x47f6de;
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x4d5);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg_21._M_dataplus._M_p != paVar14) {
                  Args_9_01 = (char (*) [84])0x47f6f5;
                  operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1);
                }
              }
              if (*(uint *)*local_60 < Args_5_00->MipLevel) {
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&local_10c;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[13],unsigned_int,char[42],unsigned_int,char[2]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].MipLevel (",
                           (char (*) [13])Args_5_00,
                           (uint *)") must not exceed the first mip in tail (",local_60,
                           (uint *)0x752f31,(char (*) [2])Args_9_01);
                Args_9_01 = (char (*) [84])0x47f774;
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x4d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg_21._M_dataplus._M_p != paVar14) {
                  Args_9_01 = (char (*) [84])0x47f78b;
                  operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1);
                }
              }
              Args_5_01 = &pSVar5[uVar10].Region;
              if (Args_5_00->MipLevel < *(uint *)*local_60) {
                if (Args_5_00->OffsetInMipTail != 0) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[69]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)
                             "].OffsetInMipTail must be zero when Range.MipLevel is not a tail mip",
                             (char (*) [69])Args_9_01);
                  Args_9_01 = (char (*) [84])0x47f804;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4dd);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar14) {
                    Args_9_01 = (char (*) [84])0x47f81b;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                if ((((Args_5_00->Region).MaxX <= (Args_5_00->Region).MinX) ||
                    ((Args_5_00->Region).MaxY <= (Args_5_00->Region).MinY)) ||
                   ((Args_5_00->Region).MaxZ <= (Args_5_00->Region).MinZ)) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[23]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"].Region must be valid",(char (*) [23])Args_9_01);
                  Args_9_01 = (char (*) [84])0x47f88f;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4df);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar14) {
                    Args_9_01 = (char (*) [84])0x47f8a6;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                UVar9 = MipWidth;
                local_50 = &(Args_5_00->Region).MaxX;
                uVar11 = (Args_5_00->Region).MaxX;
                if (MipWidth < uVar11) {
                  uVar2 = *(uint *)(*local_98 + 0x24);
                  Capacity = CONCAT44(Capacity._4_4_,uVar2);
                  if ((uVar2 ^ uVar2 - 1) <= uVar2 - 1) {
                    FormatString<char[12],unsigned_int,char[23]>
                              (&msg_21,(Diligent *)"Alignment (",(char (*) [12])&Capacity,
                               (uint *)") must be a power of 2",(char (*) [23])in_R8);
                    Args_9_01 = (char (*) [84])0x47f916;
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"AlignUp",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/../../../Common/interface/Align.hpp"
                               ,0x34);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != paVar14) {
                      Args_9_01 = (char (*) [84])0x47f92d;
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if (uVar11 != (-(int)Capacity & (UVar9 + (int)Capacity) - 1)) {
                    in_R8 = "].pRanges[";
                    in_R9 = (char (*) [45])&local_10c;
                    FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[40],unsigned_int,char[2]>
                              (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                               (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                               (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MaxX (",
                               (char (*) [16])local_50,
                               (uint *)") must not exceed the mip level width (",
                               (char (*) [40])&MipWidth,(uint *)0x752f31,(char (*) [2])Args_9_01);
                    Args_9_01 = (char (*) [84])0x47f9b9;
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                               ,0x4e1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != paVar14) {
                      Args_9_01 = (char (*) [84])0x47f9d0;
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                UVar9 = MipHeight;
                pUVar16 = &(Args_5_00->Region).MaxY;
                uVar11 = (Args_5_00->Region).MaxY;
                if (MipHeight < uVar11) {
                  uVar2 = *(uint *)(*local_98 + 0x28);
                  Capacity = CONCAT44(Capacity._4_4_,uVar2);
                  if ((uVar2 ^ uVar2 - 1) <= uVar2 - 1) {
                    FormatString<char[12],unsigned_int,char[23]>
                              (&msg_21,(Diligent *)"Alignment (",(char (*) [12])&Capacity,
                               (uint *)") must be a power of 2",(char (*) [23])in_R8);
                    Args_9_01 = (char (*) [84])0x47fa38;
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"AlignUp",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/../../../Common/interface/Align.hpp"
                               ,0x34);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != &msg_21.field_2) {
                      Args_9_01 = (char (*) [84])0x47fa54;
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if (uVar11 != (-(int)Capacity & (UVar9 + (int)Capacity) - 1)) {
                    in_R8 = "].pRanges[";
                    in_R9 = (char (*) [45])&local_10c;
                    FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[41],unsigned_int,char[2]>
                              (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                               (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                               (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MaxY (",
                               (char (*) [16])pUVar16,
                               (uint *)") must not exceed the mip level height (",
                               (char (*) [41])&MipHeight,(uint *)0x752f31,(char (*) [2])Args_9_01);
                    Args_9_01 = (char (*) [84])0x47fada;
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                               ,0x4e3);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != &msg_21.field_2) {
                      Args_9_01 = (char (*) [84])0x47faf6;
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                UVar9 = MipDepth;
                local_58 = &(Args_5_00->Region).MaxZ;
                uVar11 = (Args_5_00->Region).MaxZ;
                if (MipDepth < uVar11) {
                  uVar2 = *(uint *)(*local_98 + 0x2c);
                  Capacity = CONCAT44(Capacity._4_4_,uVar2);
                  if ((uVar2 ^ uVar2 - 1) <= uVar2 - 1) {
                    FormatString<char[12],unsigned_int,char[23]>
                              (&msg_21,(Diligent *)"Alignment (",(char (*) [12])&Capacity,
                               (uint *)") must be a power of 2",(char (*) [23])in_R8);
                    Args_9_01 = (char (*) [84])0x47fb68;
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"AlignUp",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/../../../Common/interface/Align.hpp"
                               ,0x34);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != &msg_21.field_2) {
                      Args_9_01 = (char (*) [84])0x47fb84;
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if (uVar11 != (-(int)Capacity & (UVar9 + (int)Capacity) - 1)) {
                    in_R8 = "].pRanges[";
                    in_R9 = (char (*) [45])&local_10c;
                    FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[40],unsigned_int,char[2]>
                              (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                               (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                               (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MaxZ (",
                               (char (*) [16])local_58,
                               (uint *)") must not exceed the mip level depth (",
                               (char (*) [40])&MipDepth,(uint *)0x752f31,(char (*) [2])Args_9_01);
                    Args_9_01 = (char (*) [84])0x47fc0d;
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                               ,0x4e5);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != &msg_21.field_2) {
                      Args_9_01 = (char (*) [84])0x47fc29;
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                Args_7 = local_40;
                iVar7 = local_84;
                if (Args_5_01->MinX % *(uint *)*local_40 != 0) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[41],unsigned_int,char[2]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MinX (",
                             (char (*) [16])Args_5_01,
                             (uint *)") must be a multiple of the tile width (",local_40,
                             (uint *)0x752f31,(char (*) [2])Args_9_01);
                  Args_9_01 = (char (*) [84])0x47fcb1;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4e8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != &msg_21.field_2) {
                    Args_9_01 = (char (*) [84])0x47fccd;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                if ((Args_5_00->Region).MinY % *(uint *)*local_68 != 0) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[42],unsigned_int,char[2]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MinY (",
                             (char (*) [16])&(Args_5_00->Region).MinY,
                             (uint *)") must be a multiple of the tile height (",local_68,
                             (uint *)0x752f31,(char (*) [2])Args_9_01);
                  Args_9_01 = (char (*) [84])0x47fd59;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4ea);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != &msg_21.field_2) {
                    Args_9_01 = (char (*) [84])0x47fd75;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                if ((Args_5_00->Region).MinZ % *(uint *)*local_70 != 0) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[41],unsigned_int,char[2]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MinZ (",
                             (char (*) [16])&(Args_5_00->Region).MinZ,
                             (uint *)") must be a multiple of the tile depth (",local_70,
                             (uint *)0x752f31,(char (*) [2])Args_9_01);
                  Args_9_01 = (char (*) [84])0x47fe01;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4ec);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != &msg_21.field_2) {
                    Args_9_01 = (char (*) [84])0x47fe1d;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                if ((((Args_5_00->Region).MaxX - (Args_5_00->Region).MinX) % *(uint *)*Args_7 != 0)
                   && (*local_50 != MipWidth)) {
                  Capacity = CONCAT44(Capacity._4_4_,
                                      (Args_5_00->Region).MaxX - (Args_5_00->Region).MinX);
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[17],unsigned_int,char[41],unsigned_int,char[2]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region width (",
                             (char (*) [17])&Capacity,
                             (uint *)") must be a multiple of the tile width (",Args_7,
                             (uint *)0x752f31,(char (*) [2])Args_9_01);
                  Args_9_01 = (char (*) [84])0x47fec1;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4ee);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != &msg_21.field_2) {
                    Args_9_01 = (char (*) [84])0x47fedd;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                if ((((Args_5_00->Region).MaxY - (Args_5_00->Region).MinY) % *(uint *)*local_68 != 0
                    ) && (*pUVar16 != MipHeight)) {
                  Capacity = CONCAT44(Capacity._4_4_,
                                      (Args_5_00->Region).MaxY - (Args_5_00->Region).MinY);
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[18],unsigned_int,char[40],unsigned_int,char[2]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region height (",
                             (char (*) [18])&Capacity,
                             (uint *)") must be multiple of the tile height (",
                             (char (*) [40])local_68,(uint *)0x752f31,(char (*) [2])Args_9_01);
                  Args_9_01 = (char (*) [84])0x47ff88;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != &msg_21.field_2) {
                    Args_9_01 = (char (*) [84])0x47ffa4;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                if ((((Args_5_00->Region).MaxZ - (Args_5_00->Region).MinZ) % *(uint *)*local_70 != 0
                    ) && (*local_58 != MipDepth)) {
                  Capacity = CONCAT44(Capacity._4_4_,
                                      (Args_5_00->Region).MaxZ - (Args_5_00->Region).MinZ);
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[17],unsigned_int,char[41],unsigned_int,char[2]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region depth (",
                             (char (*) [17])&Capacity,
                             (uint *)") must be a multiple of the tile depth (",local_70,
                             (uint *)0x752f31,(char (*) [2])Args_9_01);
                  Args_9_01 = (char (*) [84])0x480056;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4f2);
LAB_0048037e:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != &msg_21.field_2) {
                    Args_9_01 = (char (*) [84])0x48039a;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
              }
              else {
                if (((((Args_5_01->MinX != 0) || ((Args_5_00->Region).MaxX != 0)) ||
                     ((Args_5_00->Region).MinY != 0)) ||
                    (((Args_5_00->Region).MaxY != 0 || ((Args_5_00->Region).MinZ != 0)))) ||
                   ((Args_5_00->Region).MaxZ != 1)) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[59]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"].Region must be default when Range.MipLevel is a tail mip",
                             (char (*) [59])Args_9_01);
                  Args_9_01 = (char (*) [84])0x4800da;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4f7);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar14) {
                    Args_9_01 = (char (*) [84])0x4800f1;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                pUVar15 = &Args_5_00->OffsetInMipTail;
                Args_8 = &Args_5_00->MemorySize;
                if (*(ulong *)*local_78 < Args_5_00->MemorySize + Args_5_00->OffsetInMipTail) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[30],unsigned_long,char[19],unsigned_long,char[34],unsigned_long,char[2]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"] specifies OffsetInMipTail (",(char (*) [30])pUVar15,
                             (unsigned_long *)") and MemorySize (",(char (*) [19])Args_8,
                             (unsigned_long *)") that exceed the mip tail size (",
                             (char (*) [34])local_78,(unsigned_long *)0x752f31,
                             (char (*) [2])Args_9_01);
                  Args_9_01 = (char (*) [84])0x48018a;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4fa);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar14) {
                    Args_9_01 = (char (*) [84])0x4801a1;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                if (*pUVar15 % (ulong)*local_90 != 0) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[20],unsigned_long,char[49],unsigned_int,char[2]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].OffsetInMipTail ("
                             ,(char (*) [20])pUVar15,
                             (unsigned_long *)") must be a multiple of the texture block size (",
                             (char (*) [49])local_90,(uint *)0x752f31,(char (*) [2])Args_9_01);
                  Args_9_01 = (char (*) [84])0x48022a;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x4fd);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar14) {
                    Args_9_01 = (char (*) [84])0x480241;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                if (((*(char *)((long)(local_98 + 1) + 7) & 1U) != 0) &&
                   (Args_5_00->ArraySlice != 0)) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[15],unsigned_int,char[34]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].ArraySlice (",
                             (char (*) [15])&Args_5_00->ArraySlice,
                             (uint *)") must be 0 for a single mip tail",(char (*) [34])Args_9_01);
                  Args_9_01 = (char (*) [84])0x4802be;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x502);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar14) {
                    Args_9_01 = (char (*) [84])0x4802d5;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                if ((iVar7 == 6) &&
                   ((*pUVar15 != 0 || ((*Args_8 != 0 && (*Args_8 != *(Uint64 *)*local_78)))))) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[63],char[18],unsigned_long,char[32],unsigned_long,char[39],unsigned_long,char[10]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)
                             "]: in Metal, mip tail must be bound in a single memory range: ",
                             (char (*) [63])0x76bd9d,(char (*) [18])pUVar15,
                             (unsigned_long *)") must be zero and MemorySize (",
                             (char (*) [32])Args_8,
                             (unsigned_long *)") must be equal to the mip tail size (",local_78,
                             (unsigned_long *)") or zero",in_stack_fffffffffffffee8);
                  Args_9_01 = (char (*) [84])0x48037e;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x50a);
                  goto LAB_0048037e;
                }
              }
              UVar9 = (TexDesc->field_3).ArraySize;
              UVar12 = 1;
              if ((0x1a8U >> (TexDesc->Type & 0x1f) & 1) != 0) {
                UVar12 = UVar9;
              }
              uVar11 = (uint)TexDesc->Type;
              if (8 < uVar11) {
                UVar12 = 1;
              }
              paVar14 = &msg_21.field_2;
              if (UVar12 <= Args_5_00->ArraySlice) {
                if ((8 < uVar11) || ((0x1a8U >> (uVar11 & 0x1f) & 1) == 0)) {
                  UVar9 = 1;
                }
                Capacity = CONCAT44(Capacity._4_4_,UVar9);
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&local_10c;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[15],unsigned_int,char[37],unsigned_int,char[2]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].ArraySlice (",
                           (char (*) [15])&Args_5_00->ArraySlice,
                           (uint *)") must be less than the array size (",(char (*) [37])&Capacity,
                           (uint *)0x752f31,(char (*) [2])Args_9_01);
                Args_9_01 = (char (*) [84])0x48045c;
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x50f);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg_21._M_dataplus._M_p != paVar14) {
                  Args_9_01 = (char (*) [84])0x480473;
                  operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1);
                }
              }
              pUVar15 = &Args_5_00->MemorySize;
              if (Args_5_00->MemorySize % (ulong)*local_90 != 0) {
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&local_10c;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[15],unsigned_long,char[49],unsigned_int,char[2]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].MemorySize (",
                           (char (*) [15])pUVar15,
                           (unsigned_long *)") must be a multiple of the texture block size (",
                           (char (*) [49])local_90,(uint *)0x752f31,(char (*) [2])Args_9_01);
                Args_9_01 = (char (*) [84])0x480501;
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x514);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg_21._M_dataplus._M_p != paVar14) {
                  Args_9_01 = (char (*) [84])0x480518;
                  operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1);
                }
              }
              if (iVar7 != 6) {
                if ((*pUVar15 != 0) && (Args_5_00->MipLevel < *(uint *)*local_60)) {
                  uVar11 = *(uint *)(*local_98 + 0x2c);
                  in_R8 = (char *)(ulong)uVar11;
                  uVar11 = ((~(Args_5_00->Region).MinY + (Args_5_00->Region).MaxY +
                            *(uint *)(*local_98 + 0x28)) / *(uint *)(*local_98 + 0x28)) *
                           ((~(Args_5_00->Region).MinX + (Args_5_00->Region).MaxX +
                            *(uint *)(*local_98 + 0x24)) / *(uint *)(*local_98 + 0x24)) *
                           ((~(Args_5_00->Region).MinZ + (Args_5_00->Region).MaxZ + uVar11) / uVar11
                           );
                  Capacity = CONCAT44(Capacity._4_4_,uVar11);
                  in_R9 = local_98;
                  if ((ulong)*(uint *)((long)(local_98 + 1) + 3) * (ulong)uVar11 - *pUVar15 != 0) {
                    in_R8 = "].pRanges[";
                    in_R9 = (char (*) [45])&local_10c;
                    FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[15],unsigned_long,char[50],unsigned_int,char[26]>
                              (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                               (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                               (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].MemorySize (",
                               (char (*) [15])pUVar15,
                               (unsigned_long *)") does not match the sparse memory blocks count (",
                               (char (*) [50])&Capacity,(uint *)") in the specified region",
                               (char (*) [26])Args_9_01);
                    Args_9_01 = (char (*) [84])0x480618;
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                               ,0x51f);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != paVar14) {
                      Args_9_01 = (char (*) [84])0x48062f;
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                if ((Args_5_00->MipLevel == *(Uint32 *)*local_60) && (*pUVar15 == 0)) {
                  in_R8 = "].pRanges[";
                  in_R9 = (char (*) [45])&local_10c;
                  FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[30]>
                            (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                             (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                             (uint *)"].pRanges[",(char (*) [11])in_R9,
                             (uint *)"].MemorySize must not be zero",(char (*) [30])Args_9_01);
                  Args_9_01 = (char (*) [84])0x48069b;
                  DebugAssertionFailed
                            (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                             ,0x527);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg_21._M_dataplus._M_p != paVar14) {
                    Args_9_01 = (char (*) [84])0x4806b2;
                    operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                pIVar4 = Args_5_00->pMemory;
                if (pIVar4 != (IDeviceMemory *)0x0) {
                  Args_5_03 = (char (*) [43])0x4806d0;
                  iVar8 = (*(pIVar4->super_IDeviceObject).super_IObject._vptr_IObject[10])
                                    (pIVar4,local_48->pTexture);
                  if ((char)iVar8 == '\0') {
                    in_R8 = "].pRanges[";
                    in_R9 = (char (*) [45])&local_10c;
                    FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[43]>
                              (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                               (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                               (uint *)"].pRanges[",(char (*) [11])in_R9,
                               (uint *)"].pMemory must be compatible with pTexture",Args_5_03);
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                               ,0x52d);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != paVar14) {
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                  }
                  pacVar17 = (char (*) [2])0x48074b;
                  iVar8 = (*(Args_5_00->pMemory->super_IDeviceObject).super_IObject._vptr_IObject[9]
                          )();
                  Capacity = CONCAT44(extraout_var_07,iVar8);
                  if (Capacity < Args_5_00->MemorySize + Args_5_00->MemoryOffset) {
                    in_R8 = "].pRanges[";
                    in_R9 = (char (*) [45])&local_10c;
                    FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[27],unsigned_long,char[19],unsigned_long,char[36],unsigned_long,char[2]>
                              (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                               (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                               (uint *)"].pRanges[",(char (*) [11])in_R9,
                               (uint *)"] specifies MemoryOffset (",
                               (char (*) [27])&Args_5_00->MemoryOffset,
                               (unsigned_long *)") and MemorySize (",(char (*) [19])pUVar15,
                               (unsigned_long *)") that exceed the memory capacity (",
                               (char (*) [36])&Capacity,(unsigned_long *)0x752f31,pacVar17);
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                               ,0x532);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != paVar14) {
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                  }
                  Args_9_01 = (char (*) [84])0x4807fd;
                  iVar8 = (*(Args_5_00->pMemory->super_IDeviceObject).super_IObject._vptr_IObject[4]
                          )();
                  uVar10 = *(ulong *)(CONCAT44(extraout_var_08,iVar8) + 0x10);
                  if (uVar10 < Args_5_00->MemoryOffset % uVar10 + Args_5_00->MemorySize) {
                    in_R8 = "].pRanges[";
                    in_R9 = (char (*) [45])&local_10c;
                    FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[27],unsigned_long,char[19],unsigned_long,char[84]>
                              (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                               (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                               (uint *)"].pRanges[",(char (*) [11])in_R9,
                               (uint *)"] specifies MemoryOffset (",
                               (char (*) [27])&Args_5_00->MemoryOffset,
                               (unsigned_long *)") and MemorySize (",(char (*) [19])pUVar15,
                               (unsigned_long *)
                               ") that don\'t fit into a single page. In Direct3D12 and Vulkan this will be an error"
                               ,Args_9_01);
                    Args_9_01 = (char (*) [84])0x480880;
                    DebugAssertionFailed
                              (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                               ,0x539);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)msg_21._M_dataplus._M_p != paVar14) {
                      Args_9_01 = (char (*) [84])0x480897;
                      operator_delete(msg_21._M_dataplus._M_p,
                                      msg_21.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
              }
              pSVar13 = local_48;
              if ((Args_5_00->pMemory == (IDeviceMemory *)0x0) && (Args_5_00->MemoryOffset != 0)) {
                in_R8 = "].pRanges[";
                in_R9 = (char (*) [45])&local_10c;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[49]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&local_110,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,
                           (uint *)"]: pMemory is null, but MemoryOffset is not zero",
                           (char (*) [49])Args_9_01);
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x540);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg_21._M_dataplus._M_p != paVar14) {
                  operator_delete(msg_21._M_dataplus._M_p,msg_21.field_2._M_allocated_capacity + 1);
                }
              }
              local_10c = local_10c + 1;
              Attribs = local_a0;
            } while (local_10c < pSVar13->NumRanges);
          }
        }
      }
      local_110 = local_110 + 1;
      uVar10 = (ulong)local_110;
      in_RCX = local_80;
    } while (local_110 < *local_80);
  }
  if (Attribs->NumWaitFences != 0) {
    if (Attribs->ppWaitFences == (IFence **)0x0) {
      FormatString<char[41],char[59]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"ppWaitFences must not be null if NumWaitFences is not zero",
                 (char (*) [59])in_RCX);
      in_RCX = (Uint32 *)0x548;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x548);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,
                        CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                 msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    if (Attribs->pWaitFenceValues == (Uint64 *)0x0) {
      FormatString<char[41],char[63]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pWaitFenceValues must not be null if NumWaitFences is not zero",
                 (char (*) [63])in_RCX);
      in_RCX = (Uint32 *)0x549;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x549);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,
                        CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                 msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    if ((Attribs->pWaitFenceValues != (Uint64 *)0x0) &&
       (msg_21._M_dataplus._M_p = msg_21._M_dataplus._M_p & 0xffffffff00000000,
       Attribs->NumWaitFences != 0)) {
      uVar10 = 0;
      do {
        if (Attribs->ppWaitFences[uVar10] == (IFence *)0x0) {
          FormatString<char[41],char[14],unsigned_int,char[19]>
                    (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                     (char (*) [41])"ppWaitFences[",(char (*) [14])&msg_21,
                     (uint *)"] must not be null",(char (*) [19])in_R9);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x54f);
          Attribs = local_a0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,
                            CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                     msg.field_2._M_allocated_capacity._0_4_) + 1);
            Attribs = local_a0;
          }
        }
        in_RCX = (Uint32 *)((ulong)msg_21._M_dataplus._M_p & 0xffffffff);
        iVar7 = (*(Attribs->ppWaitFences[(long)in_RCX]->super_IDeviceObject).super_IObject.
                  _vptr_IObject[4])();
        if (*(char *)(CONCAT44(extraout_var_09,iVar7) + 8) != '\x01') {
          FormatString<char[41],char[14],unsigned_int,char[23]>
                    (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                     (char (*) [41])"ppWaitFences[",(char (*) [14])&msg_21,
                     (uint *)"] must be GENERAL type",(char (*) [23])in_R9);
          in_RCX = (Uint32 *)0x550;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x550);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,
                            CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                     msg.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
        uVar11 = (uint)msg_21._M_dataplus._M_p + 1;
        uVar10 = (ulong)uVar11;
        msg_21._M_dataplus._M_p._0_4_ = uVar11;
        Attribs = local_a0;
      } while (uVar11 < local_a0->NumWaitFences);
    }
  }
  if (Attribs->NumSignalFences != 0) {
    if (Attribs->ppSignalFences == (IFence **)0x0) {
      FormatString<char[41],char[63]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"ppSignalFences must not be null if NumSignalFences is not zero",
                 (char (*) [63])in_RCX);
      in_RCX = (Uint32 *)0x557;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x557);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,
                        CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                 msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    if (Attribs->pSignalFenceValues == (Uint64 *)0x0) {
      FormatString<char[41],char[67]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pSignalFenceValues must not be null if NumSignalFences is not zero"
                 ,(char (*) [67])in_RCX);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x558);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,
                        CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                 msg.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    if ((Attribs->pSignalFenceValues != (Uint64 *)0x0) &&
       (msg_21._M_dataplus._M_p = msg_21._M_dataplus._M_p & 0xffffffff00000000,
       Attribs->NumSignalFences != 0)) {
      uVar11 = 0;
      do {
        if (Attribs->ppSignalFences[uVar11] == (IFence *)0x0) {
          FormatString<char[41],char[16],unsigned_int,char[19]>
                    (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                     (char (*) [41])"ppSignalFences[",(char (*) [16])&msg_21,
                     (uint *)"] must not be null",(char (*) [19])in_R9);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x55e);
          Attribs = local_a0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,
                            CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                     msg.field_2._M_allocated_capacity._0_4_) + 1);
            Attribs = local_a0;
          }
        }
        iVar7 = (*(Attribs->ppSignalFences[(ulong)msg_21._M_dataplus._M_p & 0xffffffff]->
                  super_IDeviceObject).super_IObject._vptr_IObject[4])();
        if (*(char *)(CONCAT44(extraout_var_10,iVar7) + 8) != '\x01') {
          FormatString<char[41],char[16],unsigned_int,char[23]>
                    (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                     (char (*) [41])"ppSignalFences[",(char (*) [16])&msg_21,
                     (uint *)"] must be GENERAL type",(char (*) [23])in_R9);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x55f);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,
                            CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                     msg.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
        uVar11 = (uint)msg_21._M_dataplus._M_p + 1;
        msg_21._M_dataplus._M_p._0_4_ = uVar11;
        Attribs = local_a0;
      } while (uVar11 < local_a0->NumSignalFences);
    }
  }
  return true;
}

Assistant:

bool VerifyBindSparseResourceMemoryAttribs(const IRenderDevice* pDevice, const BindSparseResourceMemoryAttribs& Attribs)
{
#define CHECK_BIND_SPARSE_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Bind sparse memory attribs are invalid: ", __VA_ARGS__)

    const SparseResourceProperties& SparseRes = pDevice->GetAdapterInfo().SparseResources;

    if (Attribs.NumBufferBinds != 0)
    {
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.pBufferBinds != nullptr, "NumBufferBinds is ", Attribs.NumBufferBinds, ", but pBufferBinds is null");
        CHECK_BIND_SPARSE_ATTRIBS((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_BUFFER) != 0, "NumBufferBinds must be zero if SPARSE_RESOURCE_CAP_FLAG_BUFFER capability is not supported");
    }
    if (Attribs.NumTextureBinds != 0)
    {
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.pTextureBinds != nullptr, "NumTextureBinds is ", Attribs.NumTextureBinds, ", but pTextureBinds is null");
        CHECK_BIND_SPARSE_ATTRIBS((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D) != 0, "NumTextureBinds must be zero if SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D capability is not supported");
    }

    CHECK_BIND_SPARSE_ATTRIBS(Attribs.NumBufferBinds > 0 || Attribs.NumTextureBinds > 0, "One of NumBufferBinds and NumTextureBinds must not be zero");

#ifdef DILIGENT_DEVELOPMENT
    const bool IsMetal = pDevice->GetDeviceInfo().IsMetalDevice();

    for (Uint32 i = 0; i < Attribs.NumBufferBinds; ++i)
    {
        const SparseBufferMemoryBindInfo& Bind = Attribs.pBufferBinds[i];
        CHECK_BIND_SPARSE_ATTRIBS(Bind.pBuffer != nullptr, "pBufferBinds[", i, "].pBuffer must not be null");
        CHECK_BIND_SPARSE_ATTRIBS(Bind.NumRanges != 0, "pBufferBinds[", i, "].NumRanges must not be zero");
        CHECK_BIND_SPARSE_ATTRIBS(Bind.pRanges != nullptr, "pBufferBinds[", i, "].pRanges must not be null");

        if (Bind.pBuffer == nullptr)
            continue;

        const BufferDesc& Desc = Bind.pBuffer->GetDesc();
        CHECK_BIND_SPARSE_ATTRIBS(Desc.Usage == USAGE_SPARSE, "pBufferBinds[", i, "].pBuffer must be created with USAGE_SPARSE");

        if (Bind.pRanges == nullptr)
            continue;

        const SparseBufferProperties& BuffSparseProps = Bind.pBuffer->GetSparseProperties();
        for (Uint32 r = 0; r < Bind.NumRanges; ++r)
        {
            const SparseBufferMemoryBindRange& Range = Bind.pRanges[r];
            CHECK_BIND_SPARSE_ATTRIBS(Range.BufferOffset + Range.MemorySize <= Desc.Size,
                                      "pBufferBinds[", i, "].pRanges[", r, "] specifies a range with offset ", Range.BufferOffset, " and size ",
                                      Range.MemorySize, " that exceeds the buffer size (", Desc.Size, ")");
            CHECK_BIND_SPARSE_ATTRIBS(Range.BufferOffset % BuffSparseProps.BlockSize == 0,
                                      "pBufferBinds[", i, "].pRanges[", r, "].BufferOffset (", Range.BufferOffset,
                                      ") must be a multiple of the buffer block size (", BuffSparseProps.BlockSize, ")");

            CHECK_BIND_SPARSE_ATTRIBS(Range.MemorySize != 0,
                                      "pBufferBinds[", i, "].pRanges[", r, "].MemorySize must not be zero");
            CHECK_BIND_SPARSE_ATTRIBS(Range.MemorySize % BuffSparseProps.BlockSize == 0,
                                      "pBufferBinds[", i, "].pRanges[", r, "].MemorySize must be a multiple of the buffer block size (", BuffSparseProps.BlockSize, ")");

            if (Range.pMemory != nullptr)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Range.pMemory->IsCompatible(Bind.pBuffer),
                                          "pBufferBinds[", i, "].pRanges[", r, "].pMemory must be compatible with pBuffer");

                const Uint64 Capacity = Range.pMemory->GetCapacity();
                CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset + Range.MemorySize <= Capacity,
                                          "pBufferBinds[", i, "].pRanges[", r, "] specifies a range with offset ", Range.MemoryOffset,
                                          " and size ", Range.MemorySize, " that exceeds the device memory size (", Capacity, ")");
                // Can not check here because final memory offset depends on the device memory object implementation
                //CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset % BuffSparseProps.BlockSize == 0)

                const Uint64 PageSize = Range.pMemory->GetDesc().PageSize;
                CHECK_BIND_SPARSE_ATTRIBS((Range.MemoryOffset % PageSize) + Range.MemorySize <= PageSize,
                                          "pBufferBinds[", i, "].pRanges[", r, "] specifies a range with offset ", Range.MemoryOffset,
                                          " and size ", Range.MemorySize,
                                          " that does not fit into a single page. in Direct3D12 and Vulkan this will be an error");
            }
            else
            {
                CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset == 0,
                                          "pBufferBinds[", i, "].pRanges[", r, "]: if pMemory is null, but MemoryOffset is not zero");
            }
        }
    }

    for (Uint32 i = 0; i < Attribs.NumTextureBinds; ++i)
    {
        const SparseTextureMemoryBindInfo& Bind = Attribs.pTextureBinds[i];
        CHECK_BIND_SPARSE_ATTRIBS(Bind.pTexture != nullptr, "pTextureBinds[", i, "].pTexture must not be null");
        CHECK_BIND_SPARSE_ATTRIBS(Bind.NumRanges != 0, "pTextureBinds[", i, "].NumRanges must not be zero");
        CHECK_BIND_SPARSE_ATTRIBS(Bind.pRanges != nullptr, "pTextureBinds[", i, "].pRanges must not be null");

        if (Bind.pTexture == nullptr)
            continue;

        const TextureDesc& Desc = Bind.pTexture->GetDesc();
        CHECK_BIND_SPARSE_ATTRIBS(Desc.Usage == USAGE_SPARSE, "pTextureBinds[", i, "].pTexture must be created with USAGE_SPARSE");

        if (Bind.pRanges == nullptr)
            continue;

        const SparseTextureProperties& TexSparseProps = Bind.pTexture->GetSparseProperties();
        for (Uint32 r = 0; r < Bind.NumRanges; ++r)
        {
            const SparseTextureMemoryBindRange& Range     = Bind.pRanges[r];
            const Box&                          Region    = Range.Region;
            const MipLevelProperties            MipProps  = GetMipLevelProperties(Desc, Range.MipLevel);
            const Uint32                        MipWidth  = MipProps.StorageWidth;
            const Uint32                        MipHeight = MipProps.StorageHeight;
            const Uint32                        MipDepth  = MipProps.Depth;

            CHECK_BIND_SPARSE_ATTRIBS(Range.MipLevel < Desc.MipLevels,
                                      "pTextureBinds[", i, "].pRanges[", r, "].MipLevel (", Range.MipLevel,
                                      ") must be less than the mip level count (", Desc.MipLevels, ").");
            CHECK_BIND_SPARSE_ATTRIBS(Range.MipLevel <= TexSparseProps.FirstMipInTail,
                                      "pTextureBinds[", i, "].pRanges[", r, "].MipLevel (", Range.MipLevel,
                                      ") must not exceed the first mip in tail (", TexSparseProps.FirstMipInTail, ")");

            if (Range.MipLevel < TexSparseProps.FirstMipInTail)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Range.OffsetInMipTail == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].OffsetInMipTail must be zero when Range.MipLevel is not a tail mip");
                CHECK_BIND_SPARSE_ATTRIBS(Region.IsValid(),
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region must be valid");
                CHECK_BIND_SPARSE_ATTRIBS(Region.MaxX <= MipWidth || Region.MaxX == AlignUp(MipWidth, TexSparseProps.TileSize[0]),
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MaxX (", Region.MaxX, ") must not exceed the mip level width (", MipWidth, ")");
                CHECK_BIND_SPARSE_ATTRIBS(Region.MaxY <= MipHeight || Region.MaxY == AlignUp(MipHeight, TexSparseProps.TileSize[1]),
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MaxY (", Region.MaxY, ") must not exceed the mip level height (", MipHeight, ")");
                CHECK_BIND_SPARSE_ATTRIBS(Region.MaxZ <= MipDepth || Region.MaxZ == AlignUp(MipDepth, TexSparseProps.TileSize[2]),
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MaxZ (", Region.MaxZ, ") must not exceed the mip level depth (", MipDepth, ")");

                CHECK_BIND_SPARSE_ATTRIBS((Region.MinX % TexSparseProps.TileSize[0]) == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MinX (", Region.MinX, ") must be a multiple of the tile width (", TexSparseProps.TileSize[0], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.MinY % TexSparseProps.TileSize[1]) == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MinY (", Region.MinY, ") must be a multiple of the tile height (", TexSparseProps.TileSize[1], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.MinZ % TexSparseProps.TileSize[2]) == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MinZ (", Region.MinZ, ") must be a multiple of the tile depth (", TexSparseProps.TileSize[2], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.Width() % TexSparseProps.TileSize[0]) == 0 || Region.MaxX == MipWidth,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region width (", Region.Width(), ") must be a multiple of the tile width (", TexSparseProps.TileSize[0], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.Height() % TexSparseProps.TileSize[1]) == 0 || Region.MaxY == MipHeight,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region height (", Region.Height(), ") must be multiple of the tile height (", TexSparseProps.TileSize[1], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.Depth() % TexSparseProps.TileSize[2]) == 0 || Region.MaxZ == MipDepth,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region depth (", Region.Depth(), ") must be a multiple of the tile depth (", TexSparseProps.TileSize[2], ")");
            }
            else
            {
                CHECK_BIND_SPARSE_ATTRIBS(Region == Box{},
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region must be default when Range.MipLevel is a tail mip");
                CHECK_BIND_SPARSE_ATTRIBS(Range.OffsetInMipTail + Range.MemorySize <= TexSparseProps.MipTailSize,
                                          "pTextureBinds[", i, "].pRanges[", r, "] specifies OffsetInMipTail (", Range.OffsetInMipTail,
                                          ") and MemorySize (", Range.MemorySize, ") that exceed the mip tail size (", TexSparseProps.MipTailSize, ")");
                CHECK_BIND_SPARSE_ATTRIBS(Range.OffsetInMipTail % TexSparseProps.BlockSize == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].OffsetInMipTail (", Range.OffsetInMipTail,
                                          ") must be a multiple of the texture block size (", TexSparseProps.BlockSize, ")");

                if (TexSparseProps.Flags & SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL)
                {
                    CHECK_BIND_SPARSE_ATTRIBS(Range.ArraySlice == 0,
                                              "pTextureBinds[", i, "].pRanges[", r, "].ArraySlice (", Range.ArraySlice, ") must be 0 for a single mip tail");
                }

                if (IsMetal)
                {
                    CHECK_BIND_SPARSE_ATTRIBS(Range.OffsetInMipTail == 0 && (Range.MemorySize == 0 || Range.MemorySize == TexSparseProps.MipTailSize),
                                              "pTextureBinds[", i, "].pRanges[", r, "]: in Metal, mip tail must be bound in a single memory range: ",
                                              "OffsetInMipTail (", Range.OffsetInMipTail, ") must be zero and MemorySize (", Range.MemorySize,
                                              ") must be equal to the mip tail size (", TexSparseProps.MipTailSize, ") or zero");
                }
            }

            CHECK_BIND_SPARSE_ATTRIBS(Range.ArraySlice < Desc.GetArraySize(),
                                      "pTextureBinds[", i, "].pRanges[", r, "].ArraySlice (", Range.ArraySlice, ") must be less than the array size (", Desc.GetArraySize(), ")");

            // MemorySize can be zero
            CHECK_BIND_SPARSE_ATTRIBS(Range.MemorySize % TexSparseProps.BlockSize == 0,
                                      "pTextureBinds[", i, "].pRanges[", r, "].MemorySize (", Range.MemorySize,
                                      ") must be a multiple of the texture block size (", TexSparseProps.BlockSize, ")");

            // In Metal, MemorySize is not defined and not used
            if (!IsMetal)
            {
                if (Range.MemorySize != 0 && Range.MipLevel < TexSparseProps.FirstMipInTail)
                {
                    const uint3  TilesInBox = GetNumSparseTilesInBox(Region, TexSparseProps.TileSize);
                    const Uint32 NumBlocks  = TilesInBox.x * TilesInBox.y * TilesInBox.z;
                    CHECK_BIND_SPARSE_ATTRIBS(Uint64{NumBlocks} * Uint64{TexSparseProps.BlockSize} == Range.MemorySize,
                                              "pTextureBinds[", i, "].pRanges[", r, "].MemorySize (", Range.MemorySize, ") does not match the sparse memory blocks count (",
                                              NumBlocks, ") in the specified region");
                }

                // packed mip tail
                if (Range.MipLevel == TexSparseProps.FirstMipInTail)
                {
                    // MemorySize is used to specify how much block must be bound/unbound
                    CHECK_BIND_SPARSE_ATTRIBS(Range.MemorySize != 0,
                                              "pTextureBinds[", i, "].pRanges[", r, "].MemorySize must not be zero");
                }

                if (Range.pMemory != nullptr)
                {
                    CHECK_BIND_SPARSE_ATTRIBS(Range.pMemory->IsCompatible(Bind.pTexture),
                                              "pTextureBinds[", i, "].pRanges[", r, "].pMemory must be compatible with pTexture");

                    const Uint64 Capacity = Range.pMemory->GetCapacity();
                    CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset + Range.MemorySize <= Capacity,
                                              "pTextureBinds[", i, "].pRanges[", r, "] specifies MemoryOffset (", Range.MemoryOffset, ") and MemorySize (",
                                              Range.MemorySize, ") that exceed the memory capacity (", Capacity, ")");
                    // Can not check here because the final memory offset depends on the device memory object implementation
                    //CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset % BuffSparseProps.BlockSize == 0)

                    const Uint64 PageSize = Range.pMemory->GetDesc().PageSize;
                    CHECK_BIND_SPARSE_ATTRIBS((Range.MemoryOffset % PageSize) + Range.MemorySize <= PageSize,
                                              "pTextureBinds[", i, "].pRanges[", r, "] specifies MemoryOffset (", Range.MemoryOffset, ") and MemorySize (", Range.MemorySize,
                                              ") that don't fit into a single page. In Direct3D12 and Vulkan this will be an error");
                }
            }

            if (Range.pMemory == nullptr)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "]: pMemory is null, but MemoryOffset is not zero");
            }
        }
    }
#endif // DILIGENT_DEVELOPMENT

    if (Attribs.NumWaitFences != 0)
    {
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppWaitFences != nullptr, "ppWaitFences must not be null if NumWaitFences is not zero");
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.pWaitFenceValues != nullptr, "pWaitFenceValues must not be null if NumWaitFences is not zero");

        if (Attribs.pWaitFenceValues != nullptr)
        {
            for (Uint32 i = 0; i < Attribs.NumWaitFences; ++i)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppWaitFences[i] != nullptr, "ppWaitFences[", i, "] must not be null");
                CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppWaitFences[i]->GetDesc().Type == FENCE_TYPE_GENERAL, "ppWaitFences[", i, "] must be GENERAL type");
            }
        }
    }

    if (Attribs.NumSignalFences != 0)
    {
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppSignalFences != nullptr, "ppSignalFences must not be null if NumSignalFences is not zero");
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.pSignalFenceValues != nullptr, "pSignalFenceValues must not be null if NumSignalFences is not zero");

        if (Attribs.pSignalFenceValues != nullptr)
        {
            for (Uint32 i = 0; i < Attribs.NumSignalFences; ++i)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppSignalFences[i] != nullptr, "ppSignalFences[", i, "] must not be null");
                CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppSignalFences[i]->GetDesc().Type == FENCE_TYPE_GENERAL, "ppSignalFences[", i, "] must be GENERAL type");
            }
        }
    }

#undef CHECK_BIND_SPARSE_ATTRIBS

    return true;
}